

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void * evmap_io_get_fdinfo_(event_signal_map *map,int fd)

{
  evmap_io *ctx;
  int fd_local;
  event_signal_map *map_local;
  
  if (map->entries[fd] == (void *)0x0) {
    map_local = (event_signal_map *)0x0;
  }
  else {
    map_local = (event_signal_map *)((long)map->entries[fd] + 0x10);
  }
  return map_local;
}

Assistant:

void *
evmap_io_get_fdinfo_(struct event_io_map *map, evutil_socket_t fd)
{
	struct evmap_io *ctx;
	GET_IO_SLOT(ctx, map, fd, evmap_io);
	if (ctx)
		return ((char*)ctx) + sizeof(struct evmap_io);
	else
		return NULL;
}